

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O1

filter * filter_init(int len,float *taps)

{
  filter *__s;
  float *__dest;
  
  __s = (filter *)hmalloc(0x1018);
  memset(__s,0,0x1018);
  __dest = (float *)hmalloc((long)len * 4);
  __s->taps = __dest;
  memcpy(__dest,taps,(long)len * 4);
  __s->length = len;
  __s->pointer = len;
  return __s;
}

Assistant:

struct filter *filter_init(int len, float *taps)
{
	struct filter *f;

	f = (struct filter *) hmalloc(sizeof(struct filter));
	memset(f, 0, sizeof(struct filter));

	f->taps = (float *) hmalloc(len * sizeof(float));
	memcpy(f->taps, taps, len * sizeof(float));

	f->length = len;
	f->pointer = f->length;

	return f;
}